

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O1

vector<Bipartition,_std::allocator<Bipartition>_> * __thiscall
PhyloTree::getSplits
          (vector<Bipartition,_std::allocator<Bipartition>_> *__return_storage_ptr__,PhyloTree *this
          )

{
  pointer pPVar1;
  bool bVar2;
  pointer this_00;
  Bipartition local_58;
  
  (__return_storage_ptr__->super__Vector_base<Bipartition,_std::allocator<Bipartition>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Bipartition,_std::allocator<Bipartition>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Bipartition,_std::allocator<Bipartition>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Bipartition,_std::allocator<Bipartition>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  this_00 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar1 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pPVar1) {
    do {
      PhyloTreeEdge::asSplit(&local_58,this_00);
      std::vector<Bipartition,_std::allocator<Bipartition>_>::emplace_back<Bipartition>
                (__return_storage_ptr__,&local_58);
      local_58._vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__001bdba8;
      bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants(&local_58.partition);
      if (!bVar2) {
        __assert_fail("m_check_invariants()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                      ,0x279,
                      "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                     );
      }
      if (local_58.partition.m_bits.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.partition.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pPVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Bipartition> PhyloTree::getSplits() {
    vector<Bipartition> splits;
    splits.reserve(edges.size());
    for (auto &edge : edges) {
        splits.push_back(edge.asSplit());
    }

    return splits;
}